

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_expr_t * gs_parse_expr_comparison(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  anon_union_8_5_f029217d_for_gs_token_3 aVar2;
  anon_union_8_5_f029217d_for_gs_token_3 aVar3;
  gs_token_t *pgVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  gs_token_type gVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  _Bool _Var12;
  gs_expr_t *pgVar13;
  gs_expr_t *pgVar14;
  gs_expr_t *pgVar15;
  char cVar16;
  int iVar17;
  undefined8 in_RSI;
  undefined7 uVar18;
  bool bVar19;
  bool bVar20;
  gs_token_t token;
  gs_token_t token_1;
  
  pgVar1 = (parser->tokens).data;
  iVar17 = parser->cur_token;
  aVar2 = pgVar1[iVar17].field_3;
  pgVar4 = pgVar1 + iVar17;
  uVar5 = pgVar4->type;
  uVar6 = pgVar4->line;
  uVar7 = *(undefined8 *)&pgVar4->col;
  pgVar4 = pgVar1 + iVar17;
  gVar8 = pgVar4->type;
  iVar9 = pgVar4->line;
  iVar10 = pgVar4->col;
  uVar11 = *(undefined4 *)&pgVar4->field_0xc;
  aVar3 = pgVar1[iVar17].field_3;
  pgVar13 = gs_parse_expr_factor(parser);
  pgVar15 = pgVar13;
  if (parser->error == false) {
    do {
      pgVar4 = (parser->tokens).data;
      iVar17 = parser->cur_token;
      bVar19 = pgVar4[iVar17].type == GS_TOKEN_CHAR;
      uVar18 = (undefined7)((ulong)in_RSI >> 8);
      in_RSI = CONCAT71(uVar18,bVar19);
      bVar20 = pgVar4[iVar17].field_3.c != '+';
      if (bVar20 || !bVar19) {
LAB_0013c023:
        iVar17 = parser->cur_token;
        bVar19 = pgVar4[iVar17].type == GS_TOKEN_CHAR;
        in_RSI = CONCAT71(uVar18,bVar19);
        bVar20 = pgVar4[iVar17].field_3.c == '-';
        if (bVar20 && bVar19) {
          if (iVar17 < (parser->tokens).length) {
            parser->cur_token = iVar17 + 1;
          }
          iVar17 = 1;
          if (bVar20 && bVar19) goto LAB_0013c055;
        }
LAB_0013c063:
        bVar19 = false;
        pgVar13 = pgVar15;
      }
      else {
        if (iVar17 < (parser->tokens).length) {
          parser->cur_token = iVar17 + 1;
        }
        iVar17 = 0;
        if (bVar20 || !bVar19) goto LAB_0013c023;
LAB_0013c055:
        pgVar14 = gs_parse_expr_factor(parser);
        if (parser->error != false) goto LAB_0013c063;
        in_RSI = 0x40;
        pgVar13 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
        pgVar13->type = GS_EXPR_BINARY_OP;
        (pgVar13->token).type = gVar8;
        (pgVar13->token).line = iVar9;
        (pgVar13->token).col = iVar10;
        *(undefined4 *)&(pgVar13->token).field_0xc = uVar11;
        (pgVar13->token).field_3 = aVar3;
        (pgVar13->field_2).int_val = iVar17;
        (pgVar13->field_2).binary_op.left = pgVar15;
        (pgVar13->field_2).binary_op.right = pgVar14;
        bVar19 = true;
      }
      pgVar15 = pgVar13;
    } while (bVar19);
  }
  cVar16 = parser->error;
  do {
    while( true ) {
      if (cVar16 != '\0') {
        return pgVar13;
      }
      _Var12 = gs_eat_char_n(parser,(int)in_RSI,0x3d,0x3d);
      if (_Var12) break;
      _Var12 = gs_eat_char_n(parser,(int)in_RSI,0x3c,0x3d);
      if (_Var12) {
        pgVar15 = gs_parse_expr_comparison(parser);
        cVar16 = parser->error;
        if ((_Bool)cVar16 == false) {
          in_RSI = 0x40;
          pgVar14 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
          pgVar14->type = GS_EXPR_BINARY_OP;
          (pgVar14->token).type = uVar5;
          (pgVar14->token).line = uVar6;
          *(undefined8 *)&(pgVar14->token).col = uVar7;
          (pgVar14->token).field_3 = aVar2;
          (pgVar14->field_2).int_val = 6;
          goto LAB_0013c2ad;
        }
      }
      else {
        _Var12 = gs_eat_char_n(parser,(int)in_RSI,0x3e,0x3d);
        if (_Var12) {
          pgVar15 = gs_parse_expr_comparison(parser);
          cVar16 = parser->error;
          if ((_Bool)cVar16 == false) {
            in_RSI = 0x40;
            pgVar14 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
            pgVar14->type = GS_EXPR_BINARY_OP;
            (pgVar14->token).type = uVar5;
            (pgVar14->token).line = uVar6;
            *(undefined8 *)&(pgVar14->token).col = uVar7;
            (pgVar14->token).field_3 = aVar2;
            (pgVar14->field_2).int_val = 7;
            goto LAB_0013c2ad;
          }
        }
        else {
          pgVar4 = (parser->tokens).data;
          iVar17 = parser->cur_token;
          bVar19 = pgVar4[iVar17].type == GS_TOKEN_CHAR;
          uVar18 = (undefined7)((ulong)in_RSI >> 8);
          in_RSI = CONCAT71(uVar18,bVar19);
          bVar20 = pgVar4[iVar17].field_3.c == '>';
          if (bVar20 && bVar19) {
            if (iVar17 < (parser->tokens).length) {
              parser->cur_token = iVar17 + 1;
            }
            if (!bVar20 || !bVar19) goto LAB_0013c241;
            pgVar15 = gs_parse_expr_comparison(parser);
            cVar16 = parser->error;
            if ((_Bool)cVar16 == false) {
              in_RSI = 0x40;
              pgVar14 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
              pgVar14->type = GS_EXPR_BINARY_OP;
              (pgVar14->token).type = uVar5;
              (pgVar14->token).line = uVar6;
              *(undefined8 *)&(pgVar14->token).col = uVar7;
              (pgVar14->token).field_3 = aVar2;
              (pgVar14->field_2).int_val = 5;
LAB_0013c2ad:
              (pgVar14->field_2).binary_op.left = pgVar13;
              (pgVar14->field_2).binary_op.right = pgVar15;
              pgVar13 = pgVar14;
            }
          }
          else {
LAB_0013c241:
            iVar17 = parser->cur_token;
            bVar19 = pgVar4[iVar17].type == GS_TOKEN_CHAR;
            in_RSI = CONCAT71(uVar18,bVar19);
            bVar20 = pgVar4[iVar17].field_3.c != '<';
            if (bVar20 || !bVar19) {
              return pgVar13;
            }
            if (iVar17 < (parser->tokens).length) {
              parser->cur_token = iVar17 + 1;
            }
            if (bVar20 || !bVar19) {
              return pgVar13;
            }
            pgVar15 = gs_parse_expr_comparison(parser);
            cVar16 = parser->error;
            if ((_Bool)cVar16 == false) {
              in_RSI = 0x40;
              pgVar14 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
              pgVar14->type = GS_EXPR_BINARY_OP;
              (pgVar14->token).type = uVar5;
              (pgVar14->token).line = uVar6;
              *(undefined8 *)&(pgVar14->token).col = uVar7;
              (pgVar14->token).field_3 = aVar2;
              (pgVar14->field_2).int_val = 4;
              goto LAB_0013c2ad;
            }
          }
        }
      }
    }
    pgVar15 = gs_parse_expr_comparison(parser);
    cVar16 = parser->error;
  } while ((_Bool)cVar16 != false);
  in_RSI = 0x40;
  pgVar14 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
  pgVar14->type = GS_EXPR_BINARY_OP;
  (pgVar14->token).type = uVar5;
  (pgVar14->token).line = uVar6;
  *(undefined8 *)&(pgVar14->token).col = uVar7;
  (pgVar14->token).field_3 = aVar2;
  (pgVar14->field_2).int_val = 8;
  goto LAB_0013c2ad;
}

Assistant:

static gs_expr_t *gs_parse_expr_comparison(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_term(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char_n(parser, 2, '=', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_EQ, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '<', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LTE, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '>', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GTE, expr, right);
        }
        else if (gs_eat_char(parser, '>')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GT, expr, right);
        }
        else if (gs_eat_char(parser, '<')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LT, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}